

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O2

void duckdb::CaseConvert<false>(char *input_data,idx_t input_length,char *result_data)

{
  int32_t iVar1;
  long lVar2;
  ulong uVar3;
  int new_sz;
  int sz;
  
  for (uVar3 = 0; uVar3 < input_length; uVar3 = uVar3 + lVar2) {
    if ((long)input_data[uVar3] < 0) {
      _new_sz = 0;
      iVar1 = Utf8Proc::UTF8ToCodepoint(input_data + uVar3,&sz);
      iVar1 = Utf8Proc::CodepointToLower(iVar1);
      Utf8Proc::CodepointToUtf8(iVar1,&new_sz,result_data);
      result_data = result_data + new_sz;
      lVar2 = (long)sz;
    }
    else {
      *result_data = StringUtil::ASCII_TO_LOWER_MAP[input_data[uVar3]];
      result_data = result_data + 1;
      lVar2 = 1;
    }
  }
  return;
}

Assistant:

static void CaseConvert(const char *input_data, idx_t input_length, char *result_data) {
	for (idx_t i = 0; i < input_length;) {
		if (input_data[i] & 0x80) {
			// non-ascii character
			int sz = 0, new_sz = 0;
			auto codepoint = Utf8Proc::UTF8ToCodepoint(input_data + i, sz);
			auto converted_codepoint =
			    IS_UPPER ? Utf8Proc::CodepointToUpper(codepoint) : Utf8Proc::CodepointToLower(codepoint);
			auto success = Utf8Proc::CodepointToUtf8(converted_codepoint, new_sz, result_data);
			D_ASSERT(success);
			(void)success;
			result_data += new_sz;
			i += UnsafeNumericCast<idx_t>(sz);
		} else {
			// ascii
			*result_data = UnsafeNumericCast<char>(IS_UPPER ? StringUtil::ASCII_TO_UPPER_MAP[uint8_t(input_data[i])]
			                                                : StringUtil::ASCII_TO_LOWER_MAP[uint8_t(input_data[i])]);
			result_data++;
			i++;
		}
	}
}